

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

word * Dau_DsdToTruth(char *p,int nVars)

{
  word *pRes;
  ulong uVar1;
  undefined8 *puVar2;
  int __c;
  long lVar3;
  ulong uVar4;
  long lVar5;
  char *local_20;
  
  uVar1 = (ulong)(uint)(1 << ((char)nVars - 6U & 0x1f));
  if (nVars < 7) {
    uVar1 = 1;
  }
  if (Dau_DsdTtElems_pTtElems == 0) {
    puVar2 = &Dau_DsdTtElems_TtElems;
    lVar3 = 0;
    do {
      *(undefined8 **)((long)&Dau_DsdTtElems_pTtElems + lVar3) = puVar2;
      lVar3 = lVar3 + 8;
      puVar2 = puVar2 + 0x40;
    } while (lVar3 != 0x68);
    uVar4 = 0;
    do {
      if (uVar4 < 6) {
        lVar3 = (&Dau_DsdTtElems_pTtElems)[uVar4];
        lVar5 = 0;
        do {
          *(word *)(lVar3 + lVar5 * 8) = s_Truths6[uVar4];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x40);
      }
      else {
        lVar3 = (&Dau_DsdTtElems_pTtElems)[uVar4];
        lVar5 = 0;
        do {
          *(ulong *)(lVar3 + lVar5 * 8) =
               -(ulong)((1 << ((char)uVar4 - 6U & 0x1f) & (uint)lVar5) != 0);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x40);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != 0xc);
  }
  pRes = DAT_00dcc580;
  local_20 = p;
  if (0xc < nVars) {
    __assert_fail("nVars <= DAU_MAX_VAR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/dau/dauDsd.c"
                  ,0x266,"word *Dau_DsdToTruth(char *, int)");
  }
  if (*p == '1') {
    if (p[1] == '\0') {
      if ((int)uVar1 < 1) goto LAB_004d5bcd;
      __c = 0xff;
      goto LAB_004d5bc8;
    }
  }
  else if ((*p == '0') && (p[1] == '\0')) {
    if ((int)uVar1 < 1) goto LAB_004d5bcd;
    __c = 0;
LAB_004d5bc8:
    memset(DAT_00dcc580,__c,uVar1 << 3);
    goto LAB_004d5bcd;
  }
  Dau_DsdComputeMatches(p);
  Dau_DsdToTruth_rec(p,&local_20,Dau_DsdComputeMatches::pMatches,(word **)&Dau_DsdTtElems_pTtElems,
                     pRes,nVars);
LAB_004d5bcd:
  if (local_20[1] == '\0') {
    return pRes;
  }
  local_20 = local_20 + 1;
  __assert_fail("*++p == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/dau/dauDsd.c"
                ,0x26d,"word *Dau_DsdToTruth(char *, int)");
}

Assistant:

word * Dau_DsdToTruth( char * p, int nVars )
{
    int nWords = Abc_TtWordNum( nVars );
    word ** pTtElems = Dau_DsdTtElems();
    word * pRes = pTtElems[DAU_MAX_VAR];
    assert( nVars <= DAU_MAX_VAR );
    if ( Dau_DsdIsConst0(p) )
        Abc_TtConst0( pRes, nWords );
    else if ( Dau_DsdIsConst1(p) )
        Abc_TtConst1( pRes, nWords );
    else
        Dau_DsdToTruth_rec( p, &p, Dau_DsdComputeMatches(p), pTtElems, pRes, nVars );
    assert( *++p == 0 );
    return pRes;
}